

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O1

bool __thiscall
AEADChaCha20Poly1305::Decrypt
          (AEADChaCha20Poly1305 *this,Span<const_std::byte> cipher,Span<const_std::byte> aad,
          Nonce96 nonce,Span<std::byte> plain1,Span<std::byte> plain2)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  ulong uVar4;
  Span<std::byte> tag;
  undefined1 auVar5 [13];
  int iVar6;
  undefined4 uVar7;
  size_t sVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  Nonce96 nonce_00;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  Span<const_std::byte> cipher_00;
  byte local_48 [16];
  long local_38;
  
  sVar8 = cipher.m_size;
  input.m_data = cipher.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (plain2.m_size + plain1.m_size + 0x10 != sVar8) {
    __assert_fail("cipher.size() == plain1.size() + plain2.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20poly1305.cpp"
                  ,0x55,
                  "bool AEADChaCha20Poly1305::Decrypt(Span<const std::byte>, Span<const std::byte>, Nonce96, Span<std::byte>, Span<std::byte>)"
                 );
  }
  nonce_00._4_4_ = 0;
  nonce_00.first = nonce.first;
  lVar9 = 0;
  nonce_00.second = nonce.second;
  ChaCha20Aligned::Seek((ChaCha20Aligned *)this,nonce_00,0);
  (this->m_chacha20).m_bufleft = 0;
  tag.m_size = 0x10;
  tag.m_data = local_48;
  cipher_00.m_size = sVar8 - 0x10;
  cipher_00.m_data = input.m_data;
  anon_unknown.dwarf_5b927e1::ComputeTag(&this->m_chacha20,aad,cipher_00,tag);
  auVar10 = (undefined1  [16])0x0;
  do {
    uVar7 = *(undefined4 *)(input.m_data + lVar9 + (sVar8 - 0x10)) ^
            *(undefined4 *)(local_48 + lVar9);
    uVar4 = (ulong)(ushort)uVar7 & 0xffffffffffff00ff;
    auVar1._8_4_ = 0;
    auVar1._0_8_ = uVar4;
    auVar1[0xc] = (char)((uint)uVar7 >> 0x18);
    auVar2[8] = (char)((uint)uVar7 >> 0x10);
    auVar2._0_8_ = uVar4;
    auVar2[9] = 0;
    auVar2._10_3_ = auVar1._10_3_;
    auVar5._5_8_ = 0;
    auVar5._0_5_ = auVar2._8_5_;
    auVar13._0_4_ = (undefined4)uVar4;
    auVar3[4] = (char)((uint)uVar7 >> 8);
    auVar3._0_4_ = auVar13._0_4_;
    auVar3[5] = 0;
    auVar3._6_7_ = SUB137(auVar5 << 0x40,6);
    auVar13._4_9_ = auVar3._4_9_;
    auVar13._13_3_ = 0;
    auVar10 = auVar10 | auVar13;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x10);
  auVar11._0_8_ = auVar10._8_8_;
  auVar11._8_4_ = auVar10._8_4_;
  auVar11._12_4_ = auVar10._12_4_;
  iVar12 = SUB164(auVar11 | auVar10,4);
  iVar6 = SUB164(auVar11 | auVar10,0);
  if (iVar12 == 0 && iVar6 == 0) {
    input.m_size = plain1.m_size;
    ChaCha20::Crypt(&this->m_chacha20,input,plain1);
    input_00.m_size = plain2.m_size;
    input_00.m_data = input.m_data + plain1.m_size;
    ChaCha20::Crypt(&this->m_chacha20,input_00,plain2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar12 == 0 && iVar6 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool AEADChaCha20Poly1305::Decrypt(Span<const std::byte> cipher, Span<const std::byte> aad, Nonce96 nonce, Span<std::byte> plain1, Span<std::byte> plain2) noexcept
{
    assert(cipher.size() == plain1.size() + plain2.size() + EXPANSION);

    // Verify tag (using key drawn from block 0).
    m_chacha20.Seek(nonce, 0);
    std::byte expected_tag[EXPANSION];
    ComputeTag(m_chacha20, aad, cipher.first(cipher.size() - EXPANSION), expected_tag);
    if (timingsafe_bcmp_internal(UCharCast(expected_tag), UCharCast(cipher.last(EXPANSION).data()), EXPANSION)) return false;

    // Decrypt (starting at block 1).
    m_chacha20.Crypt(cipher.first(plain1.size()), plain1);
    m_chacha20.Crypt(cipher.subspan(plain1.size()).first(plain2.size()), plain2);
    return true;
}